

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O1

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeHalfedgeVectorsInFace
          (IntrinsicGeometryInterface *this)

{
  Vector2 *pVVar1;
  double dVar2;
  double dVar3;
  SurfaceMesh *pSVar4;
  size_t sVar5;
  pointer puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double *pdVar10;
  Vector2 *pVVar11;
  undefined8 uVar12;
  bool bVar13;
  long lVar14;
  ulong uVar15;
  size_t sVar16;
  runtime_error *this_00;
  long *plVar17;
  ulong uVar18;
  size_type *psVar19;
  long *plVar20;
  ParentMeshT *pPVar21;
  size_t i_4;
  ulong uVar22;
  size_t sVar23;
  size_t i_1;
  size_t i_3;
  size_t i;
  size_t i_2;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 extraout_var [56];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  ulong uVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  double dVar34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  long *local_138;
  long local_130;
  long local_128;
  long lStack_120;
  ulong local_118;
  ulong uStack_110;
  double local_108;
  undefined8 uStack_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [24];
  Vector2 *pVStack_b8;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->edgeLengthsQ).super_DependentQuantity.computed == false) {
    if ((this->edgeLengthsQ).super_DependentQuantity.evaluateFunc.super__Function_base._M_manager ==
        (_Manager_type)0x0) goto LAB_001868a5;
    (*(this->edgeLengthsQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->edgeLengthsQ).super_DependentQuantity.evaluateFunc);
    (this->edgeLengthsQ).super_DependentQuantity.computed = true;
  }
  if ((this->faceAreasQ).super_DependentQuantity.computed == false) {
    if ((this->faceAreasQ).super_DependentQuantity.evaluateFunc.super__Function_base._M_manager ==
        (_Manager_type)0x0) {
LAB_001868a5:
      ::std::__throw_bad_function_call();
    }
    (*(this->faceAreasQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->faceAreasQ).super_DependentQuantity.evaluateFunc);
    (this->faceAreasQ).super_DependentQuantity.computed = true;
  }
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2>::MeshData
            ((MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2> *)local_d0,
             (this->super_BaseGeometryInterface).mesh);
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2>::operator=
            (&this->halfedgeVectorsInFace,
             (MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2> *)local_d0);
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2>::~MeshData
            ((MeshData<geometrycentral::surface::Halfedge,_geometrycentral::Vector2> *)local_d0);
  pSVar4 = (this->super_BaseGeometryInterface).mesh;
  sVar5 = pSVar4->nFacesFillCount;
  if ((sVar5 == 0) ||
     (puVar6 = (pSVar4->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start, *puVar6 != 0xffffffffffffffff)) {
    sVar16 = 0;
  }
  else {
    sVar23 = 0;
    do {
      sVar16 = sVar5;
      if (sVar5 - 1 == sVar23) break;
      sVar16 = sVar23 + 1;
      lVar14 = sVar23 + 1;
      sVar23 = sVar16;
    } while (puVar6[lVar14] == 0xffffffffffffffff);
  }
  if (sVar16 != sVar5) {
    auVar30 = ZEXT864(0) << 0x40;
    uVar31 = 0x8000000000000000;
    uVar32 = 0x8000000000000000;
    local_118 = 0x8000000000000000;
    uStack_110 = 0x8000000000000000;
    do {
      puVar6 = (pSVar4->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = (pSVar4->fHalfedgeArr).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[sVar16];
      uVar8 = puVar6[uVar7];
      uVar9 = puVar6[uVar8];
      if (puVar6[uVar9] != uVar7) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/nmwsharp[P]gc-polyscope-project-template/deps/geometry-central/src/surface/intrinsic_geometry_interface.cpp"
                   ,"");
        ::std::operator+(&local_70,"GC_SAFETY_ASSERT FAILURE from ",&local_f0);
        plVar17 = (long *)::std::__cxx11::string::append((char *)&local_70);
        local_158._M_dataplus._M_p = (pointer)*plVar17;
        psVar19 = (size_type *)(plVar17 + 2);
        if ((size_type *)local_158._M_dataplus._M_p == psVar19) {
          local_158.field_2._M_allocated_capacity = *psVar19;
          local_158.field_2._8_8_ = plVar17[3];
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        }
        else {
          local_158.field_2._M_allocated_capacity = *psVar19;
        }
        local_158._M_string_length = plVar17[1];
        *plVar17 = (long)psVar19;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        ::std::__cxx11::to_string(&local_90,0x12f);
        ::std::operator+(&local_50,&local_158,&local_90);
        plVar17 = (long *)::std::__cxx11::string::append((char *)&local_50);
        local_138 = (long *)*plVar17;
        plVar20 = plVar17 + 2;
        if (local_138 == plVar20) {
          local_128 = *plVar20;
          lStack_120 = plVar17[3];
          local_138 = &local_128;
        }
        else {
          local_128 = *plVar20;
        }
        local_130 = plVar17[1];
        *plVar17 = (long)plVar20;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        plVar17 = (long *)::std::__cxx11::string::append((char *)&local_138);
        local_d0._0_8_ = *plVar17;
        pPVar21 = (ParentMeshT *)(plVar17 + 2);
        if ((ParentMeshT *)local_d0._0_8_ == pPVar21) {
          local_d0._16_8_ = pPVar21->_vptr_SurfaceMesh;
          pVStack_b8 = (Vector2 *)plVar17[3];
          local_d0._0_8_ = (ParentMeshT *)(local_d0 + 0x10);
        }
        else {
          local_d0._16_8_ = pPVar21->_vptr_SurfaceMesh;
        }
        local_d0._8_8_ = plVar17[1];
        *plVar17 = (long)pPVar21;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        ::std::runtime_error::runtime_error(this_00,(string *)local_d0);
        __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (pSVar4->useImplicitTwinFlag == true) {
        uVar15 = uVar7 >> 1;
      }
      else {
        uVar15 = (pSVar4->heEdgeArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7];
      }
      if (pSVar4->useImplicitTwinFlag == false) {
        uVar22 = (pSVar4->heEdgeArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8];
        uVar18 = (pSVar4->heEdgeArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar9];
      }
      else {
        uVar22 = uVar8 >> 1;
        uVar18 = uVar9 >> 1;
      }
      pdVar10 = (this->edgeLengths).data.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      dVar2 = pdVar10[uVar15];
      dVar24 = pdVar10[uVar22];
      dVar3 = pdVar10[uVar18];
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar3;
      dVar34 = (this->faceAreas).data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
               .m_storage.m_data[sVar16];
      dVar34 = (dVar34 + dVar34) / dVar2;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar34 * dVar34;
      auVar25 = vfmsub231sd_fma(auVar25,auVar28,auVar28);
      auVar25 = vmaxsd_avx(auVar25,auVar30._0_16_);
      if (auVar25._0_8_ < 0.0) {
        uStack_100 = 0;
        local_108 = dVar34;
        auVar30._0_8_ = sqrt(auVar25._0_8_);
        auVar30._8_56_ = extraout_var;
        auVar25 = auVar30._0_16_;
        auVar30 = ZEXT864(0) << 0x40;
        dVar34 = local_108;
        uVar31 = local_118;
        uVar32 = uStack_110;
      }
      else {
        auVar25 = vsqrtsd_avx(auVar25,auVar25);
      }
      auVar33._8_8_ = 0;
      auVar33._0_8_ = dVar2;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = dVar3 * dVar3;
      auVar28 = vfmadd231sd_fma(auVar29,auVar33,auVar33);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar24 * dVar24;
      uVar12 = vcmpsd_avx512f(auVar28,auVar27,1);
      bVar13 = (bool)((byte)uVar12 & 1);
      dVar24 = (double)((ulong)bVar13 * (auVar25._0_8_ ^ uVar31) + (ulong)!bVar13 * auVar25._0_8_);
      pVVar11 = (this->halfedgeVectorsInFace).data.
                super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
                m_storage.m_data;
      pVVar11[uVar7].x = dVar2;
      pVVar11[uVar7].y = 0.0;
      pVVar11[uVar8].x = dVar24 - dVar2;
      pVVar11[uVar8].y = dVar34;
      auVar26._0_8_ = (ulong)dVar24 ^ uVar31;
      auVar26._8_8_ = auVar25._8_8_ ^ uVar32;
      dVar2 = (double)vmovlpd_avx(auVar26);
      pVVar11[uVar9].x = dVar2;
      pVVar11[uVar9].y = -dVar34;
      sVar23 = sVar16;
      do {
        sVar16 = sVar5;
        if (sVar5 - 1 == sVar23) break;
        sVar16 = sVar23 + 1;
        lVar14 = sVar23 + 1;
        sVar23 = sVar16;
      } while ((pSVar4->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar14] == 0xffffffffffffffff);
    } while (sVar16 != sVar5);
  }
  pSVar4 = (this->super_BaseGeometryInterface).mesh;
  sVar5 = pSVar4->nHalfedgesFillCount;
  if ((sVar5 == 0) ||
     ((puVar6 = (pSVar4->heNextArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start, *puVar6 != 0xffffffffffffffff &&
      (pSVar4->nFacesFillCount <=
       *(pSVar4->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start)))) {
    sVar16 = 0;
  }
  else {
    sVar23 = 1;
    sVar16 = sVar23;
    if (sVar5 != 1) {
      do {
        if ((puVar6[sVar23] != 0xffffffffffffffff) &&
           (sVar16 = sVar23,
           pSVar4->nFacesFillCount <=
           (pSVar4->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[sVar23])) break;
        sVar23 = sVar23 + 1;
        sVar16 = sVar5;
      } while (sVar5 != sVar23);
    }
  }
  if (sVar16 != sVar5) {
    pVVar11 = (this->halfedgeVectorsInFace).data.
              super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
              m_storage.m_data;
    do {
      pVVar1 = pVVar11 + sVar16;
      pVVar1->x = NAN;
      pVVar1->y = NAN;
      sVar23 = sVar16 + 1;
      sVar16 = sVar23;
      if (sVar23 != sVar5) {
        do {
          if (((pSVar4->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start[sVar23] != 0xffffffffffffffff) &&
             (sVar16 = sVar23,
             pSVar4->nFacesFillCount <=
             (pSVar4->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[sVar23])) break;
          sVar23 = sVar23 + 1;
          sVar16 = sVar5;
        } while (sVar5 != sVar23);
      }
    } while (sVar16 != sVar5);
  }
  return;
}

Assistant:

IntrinsicGeometryInterface::IntrinsicGeometryInterface(SurfaceMesh& mesh_) : 
  BaseGeometryInterface(mesh_), 

  edgeLengthsQ              (&edgeLengths,                  std::bind(&IntrinsicGeometryInterface::computeEdgeLengths, this),               quantities),
  faceAreasQ                (&faceAreas,                    std::bind(&IntrinsicGeometryInterface::computeFaceAreas, this),                 quantities),
  vertexDualAreasQ          (&vertexDualAreas,              std::bind(&IntrinsicGeometryInterface::computeVertexDualAreas, this),           quantities),
  cornerAnglesQ             (&cornerAngles,                 std::bind(&IntrinsicGeometryInterface::computeCornerAngles, this),              quantities),
  vertexAngleSumsQ          (&vertexAngleSums,              std::bind(&IntrinsicGeometryInterface::computeVertexAngleSums, this),           quantities),
  cornerScaledAnglesQ       (&cornerScaledAngles,           std::bind(&IntrinsicGeometryInterface::computeCornerScaledAngles, this),        quantities),
  vertexGaussianCurvaturesQ (&vertexGaussianCurvatures,     std::bind(&IntrinsicGeometryInterface::computeVertexGaussianCurvatures, this),  quantities),
  faceGaussianCurvaturesQ   (&faceGaussianCurvatures,       std::bind(&IntrinsicGeometryInterface::computeFaceGaussianCurvatures, this),    quantities),
  halfedgeCotanWeightsQ     (&halfedgeCotanWeights,         std::bind(&IntrinsicGeometryInterface::computeHalfedgeCotanWeights, this),      quantities),
  edgeCotanWeightsQ         (&edgeCotanWeights,             std::bind(&IntrinsicGeometryInterface::computeEdgeCotanWeights, this),          quantities),
  shapeLengthScaleQ         (&shapeLengthScale,             std::bind(&IntrinsicGeometryInterface::computeShapeLengthScale, this),          quantities),
  meshLengthScaleQ          (&meshLengthScale,              std::bind(&IntrinsicGeometryInterface::computeMeshLengthScale, this),          quantities),
  
  halfedgeVectorsInFaceQ            (&halfedgeVectorsInFace,            std::bind(&IntrinsicGeometryInterface::computeHalfedgeVectorsInFace, this),             quantities),
  transportVectorsAcrossHalfedgeQ   (&transportVectorsAcrossHalfedge,   std::bind(&IntrinsicGeometryInterface::computeTransportVectorsAcrossHalfedge, this),    quantities),
  halfedgeVectorsInVertexQ          (&halfedgeVectorsInVertex,          std::bind(&IntrinsicGeometryInterface::computeHalfedgeVectorsInVertex, this),           quantities),
  transportVectorsAlongHalfedgeQ    (&transportVectorsAlongHalfedge,    std::bind(&IntrinsicGeometryInterface::computeTransportVectorsAlongHalfedge, this),     quantities),

  cotanLaplacianQ               (&cotanLaplacian,               std::bind(&IntrinsicGeometryInterface::computeCotanLaplacian, this),                quantities),
  vertexLumpedMassMatrixQ       (&vertexLumpedMassMatrix,       std::bind(&IntrinsicGeometryInterface::computeVertexLumpedMassMatrix, this),        quantities),
  vertexGalerkinMassMatrixQ     (&vertexGalerkinMassMatrix,     std::bind(&IntrinsicGeometryInterface::computeVertexGalerkinMassMatrix, this),      quantities),
  vertexConnectionLaplacianQ    (&vertexConnectionLaplacian,    std::bind(&IntrinsicGeometryInterface::computeVertexConnectionLaplacian, this),     quantities),
  faceGalerkinMassMatrixQ       (&faceGalerkinMassMatrix,       std::bind(&IntrinsicGeometryInterface::computeFaceGalerkinMassMatrix, this),        quantities),
  faceConnectionLaplacianQ      (&faceConnectionLaplacian,      std::bind(&IntrinsicGeometryInterface::computeFaceConnectionLaplacian, this),       quantities),
  crouzeixRaviartLaplacianQ     (&crouzeixRaviartLaplacian,     std::bind(&IntrinsicGeometryInterface::computeCrouzeixRaviartLaplacian, this),      quantities),
  crouzeixRaviartMassMatrixQ    (&crouzeixRaviartMassMatrix,    std::bind(&IntrinsicGeometryInterface::computeCrouzeixRaviartMassMatrix, this),     quantities),
  crouzeixRaviartConnectionLaplacianQ     (&crouzeixRaviartConnectionLaplacian,     std::bind(&IntrinsicGeometryInterface::computeCrouzeixRaviartConnectionLaplacian, this),      quantities),

  // DEC operators need some extra work since 8 members are grouped under one require
  DECOperatorArray{&hodge0, &hodge0Inverse, &hodge1, &hodge1Inverse, &hodge2, &hodge2Inverse, &d0, &d1},
  DECOperatorsQ(&DECOperatorArray, std::bind(&IntrinsicGeometryInterface::computeDECOperators, this), quantities)


  { }